

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::(anonymous_namespace)::GatherGLSLCompile::Uniforms_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "uniform sampler2D tex_2d;                  \nuniform isamplerCube itex_cube;            \nuniform usampler2DArray utex_2da;          \nuniform isampler2DRect itex_2dr;           \nuniform sampler2DRectShadow tex_2drs;      \nuniform sampler2DShadow tex_2ds;           \nuniform samplerCubeShadow tex_cubes;       \nuniform sampler2DArrayShadow tex_2das;     \n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Uniforms()
	{
		return "uniform sampler2D tex_2d;                  \n"
			   "uniform isamplerCube itex_cube;            \n"
			   "uniform usampler2DArray utex_2da;          \n"
			   "uniform isampler2DRect itex_2dr;           \n"
			   ""
			   "uniform sampler2DRectShadow tex_2drs;      \n"
			   "uniform sampler2DShadow tex_2ds;           \n"
			   "uniform samplerCubeShadow tex_cubes;       \n"
			   "uniform sampler2DArrayShadow tex_2das;     \n";
	}